

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

TimePoint __thiscall hta::storage::file::Metric::epoch(Metric *this,Duration interval)

{
  ssize_t sVar1;
  size_t in_RCX;
  
  sVar1 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                    (&this->file_raw_,0,(void *)0x0,in_RCX);
  if (-1 < sVar1) {
    return (TimePoint)(sVar1 - sVar1 % interval.__r);
  }
  __assert_fail("time.time_since_epoch().count() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
}

Assistant:

TimePoint Metric::epoch(Duration interval)
{
    return interval_begin(epoch(), interval);
}